

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cxx
# Opt level: O0

void nuraft::free_buffer(buffer *buf)

{
  int iVar1;
  stat_elem *psVar2;
  buffer *in_RDI;
  int in_stack_ffffffffffffff5c;
  stat_elem *in_stack_ffffffffffffff60;
  stat_elem *in_stack_ffffffffffffff68;
  stat_elem *in_stack_ffffffffffffff70;
  allocator<char> local_61;
  string local_60 [16];
  string *in_stack_ffffffffffffffb0;
  Type in_stack_ffffffffffffffbc;
  stat_mgr *in_stack_ffffffffffffffc0;
  string local_38 [48];
  buffer *local_8;
  
  local_8 = in_RDI;
  if (free_buffer(nuraft::buffer*)::num_active == '\0') {
    iVar1 = __cxa_guard_acquire(&free_buffer(nuraft::buffer*)::num_active);
    if (iVar1 != 0) {
      stat_mgr::get_instance();
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_38,"num_active_buffers",(allocator *)&stack0xffffffffffffffc7);
      psVar2 = stat_mgr::create_stat
                         (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                          in_stack_ffffffffffffffb0);
      std::__cxx11::string::~string(local_38);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffc7);
      free_buffer::num_active = psVar2;
      __cxa_guard_release(&free_buffer(nuraft::buffer*)::num_active);
    }
  }
  if (free_buffer(nuraft::buffer*)::amount_active == '\0') {
    iVar1 = __cxa_guard_acquire(&free_buffer(nuraft::buffer*)::amount_active);
    if (iVar1 != 0) {
      stat_mgr::get_instance();
      in_stack_ffffffffffffff70 = (stat_elem *)&local_61;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_60,"amount_active_buffers",(allocator *)in_stack_ffffffffffffff70);
      psVar2 = stat_mgr::create_stat
                         (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                          in_stack_ffffffffffffffb0);
      std::__cxx11::string::~string(local_60);
      std::allocator<char>::~allocator(&local_61);
      free_buffer::amount_active = psVar2;
      in_stack_ffffffffffffff68 = free_buffer::amount_active;
      __cxa_guard_release(&free_buffer(nuraft::buffer*)::amount_active);
    }
  }
  stat_elem::operator--(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  buffer::container_size(local_8);
  stat_elem::operator-=(in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68);
  if (local_8 != (buffer *)0x0) {
    operator_delete__(local_8);
  }
  return;
}

Assistant:

static void free_buffer(buffer* buf) {
    static stat_elem& num_active = *stat_mgr::get_instance()->create_stat
        (stat_elem::COUNTER, "num_active_buffers");
    static stat_elem& amount_active = *stat_mgr::get_instance()->create_stat
        (stat_elem::COUNTER, "amount_active_buffers");

    num_active--;
    amount_active -= buf->container_size();

    delete[] reinterpret_cast<char*>(buf);
}